

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall
itis::AVLTree<short>::balance
          (AVLTree<short> *this,
          vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *path)

{
  AVLTreeNode<short> **ppAVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  reference pppAVar4;
  AVLTreeNode<short> *pAVar5;
  AVLTreeNode<short> **indirect;
  iterator __end0;
  iterator __begin0;
  vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *__range2;
  vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *path_local;
  AVLTree<short> *this_local;
  
  __first = std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
            begin(path);
  __last = std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
           end(path);
  std::
  reverse<__gnu_cxx::__normal_iterator<itis::AVLTreeNode<short>***,std::vector<itis::AVLTreeNode<short>**,std::allocator<itis::AVLTreeNode<short>**>>>>
            ((__normal_iterator<itis::AVLTreeNode<short>_***,_std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>_>
              )__first._M_current,
             (__normal_iterator<itis::AVLTreeNode<short>_***,_std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>_>
              )__last._M_current);
  __end0 = std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
           begin(path);
  indirect = (AVLTreeNode<short> **)
             std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
             ::end(path);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<itis::AVLTreeNode<short>_***,_std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>_>
                                     *)&indirect), bVar2) {
    pppAVar4 = __gnu_cxx::
               __normal_iterator<itis::AVLTreeNode<short>_***,_std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>_>
               ::operator*(&__end0);
    ppAVar1 = *pppAVar4;
    AVLTreeNode<short>::updateValues(*ppAVar1);
    iVar3 = AVLTreeNode<short>::balanceFactor(*ppAVar1);
    if ((iVar3 < 2) || (iVar3 = AVLTreeNode<short>::balanceFactor((*ppAVar1)->left), iVar3 < 0)) {
      iVar3 = AVLTreeNode<short>::balanceFactor(*ppAVar1);
      if (iVar3 < 2) {
        iVar3 = AVLTreeNode<short>::balanceFactor(*ppAVar1);
        if ((iVar3 < -1) &&
           (iVar3 = AVLTreeNode<short>::balanceFactor((*ppAVar1)->right), iVar3 < 1)) {
          pAVar5 = AVLTreeNode<short>::left_rotate(*ppAVar1);
          *ppAVar1 = pAVar5;
        }
        else {
          iVar3 = AVLTreeNode<short>::balanceFactor(*ppAVar1);
          if (iVar3 < -1) {
            pAVar5 = AVLTreeNode<short>::right_rotate((*ppAVar1)->right);
            (*ppAVar1)->right = pAVar5;
            pAVar5 = AVLTreeNode<short>::left_rotate(*ppAVar1);
            *ppAVar1 = pAVar5;
          }
        }
      }
      else {
        pAVar5 = AVLTreeNode<short>::left_rotate((*ppAVar1)->left);
        (*ppAVar1)->left = pAVar5;
        pAVar5 = AVLTreeNode<short>::right_rotate(*ppAVar1);
        *ppAVar1 = pAVar5;
      }
    }
    else {
      pAVar5 = AVLTreeNode<short>::right_rotate(*ppAVar1);
      *ppAVar1 = pAVar5;
    }
    __gnu_cxx::
    __normal_iterator<itis::AVLTreeNode<short>_***,_std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void AVLTree<T>::balance(std::vector<AVLTreeNode<T> **> path) {  // starting from root
    std::reverse(path.begin(), path.end());

    for (auto indirect : path) {
      (*indirect)->updateValues();

      if ((*indirect)->balanceFactor() >= 2 and (*indirect)->left->balanceFactor() >= 0) {  // left - left
        *indirect = (*indirect)->right_rotate();

      } else if ((*indirect)->balanceFactor() >= 2) {  // left - right
        (*indirect)->left = (*indirect)->left->left_rotate();
        *indirect = (*indirect)->right_rotate();
      }

      else if ((*indirect)->balanceFactor() <= -2 and (*indirect)->right->balanceFactor() <= 0) {  // right - right
        *indirect = (*indirect)->left_rotate();

      } else if ((*indirect)->balanceFactor() <= -2) {  // right - left
        (*indirect)->right = ((*indirect)->right)->right_rotate();
        *indirect = (*indirect)->left_rotate();
      }
    }
  }